

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O3

void __thiscall
test_matrix_sparse_matrix_matrix_addition_Test::TestBody
          (test_matrix_sparse_matrix_matrix_addition_Test *this)

{
  initializer_list<double> value;
  initializer_list<double> value_00;
  initializer_list<double> value_01;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  Scalar *pSVar5;
  char *pcVar6;
  long lVar7;
  StringLike<const_char_*> *regex;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  initializer_list<unsigned_long> non_zero;
  initializer_list<unsigned_long> non_zero_00;
  initializer_list<unsigned_long> non_zero_01;
  initializer_list<unsigned_long> index;
  initializer_list<unsigned_long> index_00;
  initializer_list<unsigned_long> index_01;
  Matrix_Sparse matrix_wrong_size;
  DeathTest *gtest_dt;
  Matrix_Sparse matrix_result;
  Matrix_Sparse matrix;
  Matrix_Sparse identity;
  AssertHelper local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined1 local_2e8 [32];
  undefined1 local_2c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_2c0;
  pointer local_2b8;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  Matrix_Sparse local_258;
  Matrix_Sparse local_208;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **local_1b0;
  undefined8 uStack_1a8;
  iterator local_1a0;
  undefined8 uStack_198;
  iterator local_190;
  undefined8 uStack_188;
  Matrix_Sparse local_180;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_130;
  Matrix_Sparse local_118;
  Matrix_Sparse local_c8;
  Matrix_Sparse local_78;
  
  local_208.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
  local_208.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3;
  local_208.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x1;
  local_258.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x1;
  local_258.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
  local_190 = (iterator)local_2c8;
  local_2c8 = (undefined1  [8])0x3ff0000000000000;
  pbStack_2c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0x3ff0000000000000;
  local_2b8 = (pointer)0x3ff0000000000000;
  uStack_188 = 3;
  value._M_len = 3;
  value._M_array = local_190;
  non_zero._M_len = 4;
  non_zero._M_array = (iterator)&local_208;
  index._M_len = 3;
  index._M_array = (iterator)&local_258;
  Disa::Matrix_Sparse::Matrix_Sparse(&local_180,non_zero,index,value,3);
  local_258.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
  local_258.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3;
  local_258.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x1;
  local_2c8 = (undefined1  [8])0x2;
  pbStack_2c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_2b8 = (pointer)0x0;
  local_1a0 = (iterator)local_2e8;
  local_2e8._0_8_ = &DAT_4008000000000000;
  local_2e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc010000000000000;
  local_2e8._16_8_ = (pointer)0x4014000000000000;
  uStack_198 = 3;
  value_00._M_len = 3;
  value_00._M_array = local_1a0;
  non_zero_00._M_len = 4;
  non_zero_00._M_array = (iterator)&local_258;
  index_00._M_len = 3;
  index_00._M_array = (iterator)local_2c8;
  Disa::Matrix_Sparse::Matrix_Sparse(&local_208,non_zero_00,index_00,value_00,3);
  local_258.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258.column_size = 0;
  local_258.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_c8.row_non_zero,&local_180.row_non_zero);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_c8.column_index,&local_180.column_index);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_c8.element_value,&local_180.element_value);
  local_c8.column_size = local_180.column_size;
  Disa::operator+((Matrix_Sparse *)local_2c8,&local_c8,&local_208);
  Disa::Matrix_Sparse::operator=(&local_258,(matrix *)local_2c8);
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_2c8);
  Disa::Matrix_Sparse::~Matrix_Sparse(&local_c8);
  local_2e8._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        )0x0;
  if (local_180.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_180.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_2e8._0_8_ =
         ((long)local_180.row_non_zero.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_180.row_non_zero.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3) + -1;
  }
  local_308.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2c8,"identity.size_row()","3",(unsigned_long *)local_2e8,
             (int *)&local_308);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2e8);
    if (pbStack_2c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_2c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2b8,pcVar6);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  if (pbStack_2c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2c0,pbStack_2c0);
  }
  local_2e8._0_8_ = local_180.column_size;
  local_308.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2c8,"identity.size_column()","3",(unsigned_long *)local_2e8,
             (int *)&local_308);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2e8);
    if (pbStack_2c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_2c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2b9,pcVar6);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  if (pbStack_2c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2c0,pbStack_2c0);
  }
  local_2e8._0_8_ =
       (long)local_180.column_index.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_180.column_index.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_308.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2c8,"identity.size_non_zero()","3",(unsigned_long *)local_2e8,
             (int *)&local_308);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2e8);
    if (pbStack_2c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_2c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2ba,pcVar6);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  if (pbStack_2c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2c0,pbStack_2c0);
  }
  local_308.data_ = (AssertHelperData *)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2e8,(size_t *)&local_180);
  local_278 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2e8,(size_t *)&local_278);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2c8,"identity[0][0]","1.0",*pSVar5,1.0);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2e8);
    if (pbStack_2c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_2c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,699,pcVar6);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_2e8._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  if (pbStack_2c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2c0,pbStack_2c0);
  }
  local_308.data_ = (AssertHelperData *)0x1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2e8,(size_t *)&local_180);
  local_278 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2e8,(size_t *)&local_278);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2c8,"identity[1][1]","1.0",*pSVar5,1.0);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2e8);
    if (pbStack_2c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_2c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,700,pcVar6);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  if (pbStack_2c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2c0,pbStack_2c0);
  }
  local_308.data_ = (AssertHelperData *)0x2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2e8,(size_t *)&local_180);
  local_278 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2e8,(size_t *)&local_278);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2c8,"identity[2][2]","1.0",*pSVar5,1.0);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2e8);
    if (pbStack_2c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_2c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2bd,pcVar6);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  if (pbStack_2c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2c0,pbStack_2c0);
  }
  local_2e8._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        )0x0;
  if (local_208.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_208.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_2e8._0_8_ =
         ((long)local_208.row_non_zero.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_208.row_non_zero.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3) + -1;
  }
  local_308.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2c8,"matrix.size_row()","3",(unsigned_long *)local_2e8,
             (int *)&local_308);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2e8);
    if (pbStack_2c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_2c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2bf,pcVar6);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  if (pbStack_2c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2c0,pbStack_2c0);
  }
  local_2e8._0_8_ = local_208.column_size;
  local_308.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2c8,"matrix.size_column()","3",(unsigned_long *)local_2e8,
             (int *)&local_308);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2e8);
    if (pbStack_2c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_2c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c0,pcVar6);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  if (pbStack_2c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2c0,pbStack_2c0);
  }
  local_2e8._0_8_ =
       (long)local_208.column_index.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_208.column_index.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_308.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2c8,"matrix.size_non_zero()","3",(unsigned_long *)local_2e8,
             (int *)&local_308);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2e8);
    if (pbStack_2c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_2c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c1,pcVar6);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  if (pbStack_2c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2c0,pbStack_2c0);
  }
  local_308.data_ = (AssertHelperData *)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2e8,(size_t *)&local_208);
  local_278 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2e8,(size_t *)&local_278);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2c8,"matrix[0][2]","3.0",*pSVar5,3.0);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2e8);
    if (pbStack_2c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_2c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c2,pcVar6);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_2e8._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  if (pbStack_2c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2c0,pbStack_2c0);
  }
  local_308.data_ = (AssertHelperData *)0x1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2e8,(size_t *)&local_208);
  local_278 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2e8,(size_t *)&local_278);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2c8,"matrix[1][1]","-4.0",*pSVar5,-4.0);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2e8);
    if (pbStack_2c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_2c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c3,pcVar6);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  if (pbStack_2c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2c0,pbStack_2c0);
  }
  local_308.data_ = (AssertHelperData *)0x2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2e8,(size_t *)&local_208);
  local_278 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2e8,(size_t *)&local_278);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2c8,"matrix[2][0]","5.0",*pSVar5,5.0);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2e8);
    if (pbStack_2c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_2c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c4,pcVar6);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  if (pbStack_2c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2c0,pbStack_2c0);
  }
  local_2e8._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        )0x0;
  if (local_258.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_258.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_2e8._0_8_ =
         ((long)local_258.row_non_zero.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_258.row_non_zero.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3) + -1;
  }
  local_308.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2c8,"matrix_result.size_row()","3",(unsigned_long *)local_2e8,
             (int *)&local_308);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2e8);
    if (pbStack_2c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_2c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c6,pcVar6);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  if (pbStack_2c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2c0,pbStack_2c0);
  }
  local_2e8._0_8_ = local_258.column_size;
  local_308.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2c8,"matrix_result.size_column()","3",(unsigned_long *)local_2e8,
             (int *)&local_308);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2e8);
    if (pbStack_2c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_2c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c7,pcVar6);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  if (pbStack_2c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2c0,pbStack_2c0);
  }
  local_2e8._0_8_ =
       (long)local_258.column_index.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_258.column_index.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_308.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2c8,"matrix_result.size_non_zero()","5",(unsigned_long *)local_2e8,
             (int *)&local_308);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2e8);
    if (pbStack_2c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_2c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c8,pcVar6);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  if (pbStack_2c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2c0,pbStack_2c0);
  }
  local_308.data_ = (AssertHelperData *)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2e8,(size_t *)&local_258);
  local_278 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2e8,(size_t *)&local_278);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2c8,"matrix_result[0][0]","1.0",*pSVar5,1.0);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2e8);
    if (pbStack_2c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_2c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c9,pcVar6);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_2e8._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  if (pbStack_2c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2c0,pbStack_2c0);
  }
  local_308.data_ = (AssertHelperData *)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2e8,(size_t *)&local_258);
  local_278 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2e8,(size_t *)&local_278);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2c8,"matrix_result[0][2]","3.0",*pSVar5,3.0);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2e8);
    if (pbStack_2c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_2c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2ca,pcVar6);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  if (pbStack_2c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2c0,pbStack_2c0);
  }
  local_308.data_ = (AssertHelperData *)0x1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2e8,(size_t *)&local_258);
  local_278 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2e8,(size_t *)&local_278);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2c8,"matrix_result[1][1]","-3.0",*pSVar5,-3.0);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2e8);
    if (pbStack_2c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_2c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2cb,pcVar6);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  if (pbStack_2c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2c0,pbStack_2c0);
  }
  local_308.data_ = (AssertHelperData *)0x2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2e8,(size_t *)&local_258);
  local_278 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2e8,(size_t *)&local_278);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2c8,"matrix_result[2][0]","5.0",*pSVar5,5.0);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2e8);
    if (pbStack_2c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_2c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2cc,pcVar6);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  if (pbStack_2c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2c0,pbStack_2c0);
  }
  local_308.data_ = (AssertHelperData *)0x2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2e8,(size_t *)&local_258);
  local_278 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2e8,(size_t *)&local_278);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2c8,"matrix_result[2][2]","1.0",*pSVar5,1.0);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2e8);
    if (pbStack_2c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_2c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2cd,pcVar6);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_2e8._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  if (pbStack_2c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2c0,pbStack_2c0);
  }
  local_2e8._16_8_ = (pointer)0x2;
  local_2e8._24_8_ = (pointer)0x3;
  local_2e8._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_2e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_308.data_ = (AssertHelperData *)0x2;
  uStack_300 = 1;
  local_2f8 = 0;
  local_278 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &DAT_4008000000000000;
  uStack_270 = 0xc010000000000000;
  local_268 = 0x4014000000000000;
  uStack_1a8 = 3;
  value_01._M_len = 3;
  value_01._M_array = (iterator)&local_278;
  non_zero_01._M_len = 4;
  non_zero_01._M_array = (iterator)local_2e8;
  index_01._M_len = 3;
  index_01._M_array = (iterator)&local_308;
  local_1b0 = &local_278;
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)local_2c8,non_zero_01,index_01,value_01,4);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_308.data_ = (AssertHelperData *)0x168590;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_2e8,
               (testing *)&local_308,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_130,(PolymorphicMatcher *)local_2e8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8._8_8_);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("matrix + matrix_wrong_size",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_130,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x2d0,(DeathTest **)&local_278);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_130);
    pbVar8 = local_278;
    if (!bVar2) goto LAB_00128faa;
    if (local_278 == (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00129000;
    iVar4 = (**(code **)(*(long *)local_278 + 0x10))(local_278);
    pbVar1 = local_278;
    if (iVar4 == 0) {
      iVar4 = (**(code **)(*(long *)local_278 + 0x18))(local_278);
      bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
      cVar3 = (**(code **)(*(long *)pbVar1 + 0x20))(pbVar1,bVar2);
      if (cVar3 == '\0') {
        (**(code **)(*(long *)pbVar8 + 8))(pbVar8);
        goto LAB_00128faa;
      }
    }
    else if (iVar4 == 1) {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_118.row_non_zero,&local_208.row_non_zero);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_118.column_index,&local_208.column_index);
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_118.element_value,&local_208.element_value);
        local_118.column_size = local_208.column_size;
        Disa::operator+(&local_78,&local_118,(Matrix_Sparse *)local_2c8);
        Disa::Matrix_Sparse::~Matrix_Sparse(&local_78);
        Disa::Matrix_Sparse::~Matrix_Sparse(&local_118);
      }
      (**(code **)(*(long *)local_278 + 0x28))(local_278,2);
      (**(code **)(*(long *)pbVar1 + 0x28))(pbVar1,0);
    }
    lVar7 = *(long *)pbVar8;
  }
  else {
LAB_00128faa:
    testing::Message::Message((Message *)local_2e8);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2d0,pcVar6);
    testing::internal::AssertHelper::operator=(&local_308,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        == (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00129000;
    lVar7 = *(long *)local_2e8._0_8_;
    pbVar8 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_2e8._0_8_;
  }
  (**(code **)(lVar7 + 8))(pbVar8);
LAB_00129000:
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_2c8);
  Disa::Matrix_Sparse::~Matrix_Sparse(&local_258);
  Disa::Matrix_Sparse::~Matrix_Sparse(&local_208);
  Disa::Matrix_Sparse::~Matrix_Sparse(&local_180);
  return;
}

Assistant:

TEST(test_matrix_sparse, matrix_matrix_addition) {
  Matrix_Sparse identity({0, 1, 2, 3}, {0, 1, 2}, {1.0, 1.0, 1.0}, 3);
  Matrix_Sparse matrix({0, 1, 2, 3}, {2, 1, 0}, {3.0, -4.0, 5.0}, 3);
  Matrix_Sparse matrix_result;
  matrix_result = identity + matrix;

  EXPECT_EQ(identity.size_row(), 3);
  EXPECT_EQ(identity.size_column(), 3);
  EXPECT_EQ(identity.size_non_zero(), 3);
  EXPECT_DOUBLE_EQ(identity[0][0], 1.0);
  EXPECT_DOUBLE_EQ(identity[1][1], 1.0);
  EXPECT_DOUBLE_EQ(identity[2][2], 1.0);

  EXPECT_EQ(matrix.size_row(), 3);
  EXPECT_EQ(matrix.size_column(), 3);
  EXPECT_EQ(matrix.size_non_zero(), 3);
  EXPECT_DOUBLE_EQ(matrix[0][2], 3.0);
  EXPECT_DOUBLE_EQ(matrix[1][1], -4.0);
  EXPECT_DOUBLE_EQ(matrix[2][0], 5.0);

  EXPECT_EQ(matrix_result.size_row(), 3);
  EXPECT_EQ(matrix_result.size_column(), 3);
  EXPECT_EQ(matrix_result.size_non_zero(), 5);
  EXPECT_DOUBLE_EQ(matrix_result[0][0], 1.0);
  EXPECT_DOUBLE_EQ(matrix_result[0][2], 3.0);
  EXPECT_DOUBLE_EQ(matrix_result[1][1], -3.0);
  EXPECT_DOUBLE_EQ(matrix_result[2][0], 5.0);
  EXPECT_DOUBLE_EQ(matrix_result[2][2], 1.0);

  Matrix_Sparse matrix_wrong_size({0, 1, 2, 3}, {2, 1, 0}, {3.0, -4.0, 5.0}, 4);
  EXPECT_DEATH(matrix + matrix_wrong_size, "./*");
}